

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

char * SimpleString::copyToNewBuffer(char *bufferToCopy,size_t bufferSize)

{
  int iVar1;
  char *result;
  TestMemoryAllocator *pTVar2;
  undefined4 extraout_var;
  char cVar4;
  size_t sVar5;
  char *pcVar3;
  
  pTVar2 = stringAllocator_;
  if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
    pTVar2 = defaultNewArrayAllocator();
  }
  iVar1 = (*pTVar2->_vptr_TestMemoryAllocator[2])
                    (pTVar2,bufferSize,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
                     ,0x275);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
  if ((bufferSize != 0) && (pcVar3 != (char *)0x0)) {
    cVar4 = *bufferToCopy;
    *pcVar3 = cVar4;
    if (bufferSize != 1) {
      sVar5 = 1;
      do {
        if (cVar4 == '\0') break;
        cVar4 = bufferToCopy[sVar5];
        pcVar3[sVar5] = cVar4;
        sVar5 = sVar5 + 1;
      } while (bufferSize != sVar5);
    }
  }
  pcVar3[bufferSize - 1] = '\0';
  return pcVar3;
}

Assistant:

char* SimpleString::copyToNewBuffer(const char* bufferToCopy, size_t bufferSize)
{
    char* newBuffer = allocStringBuffer(bufferSize, __FILE__, __LINE__);
    StrNCpy(newBuffer, bufferToCopy, bufferSize);
    newBuffer[bufferSize-1] = '\0';
    return newBuffer;
}